

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_tostring(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  TRef TVar4;
  GCobj *o;
  
  uVar1 = *J->base;
  if (uVar1 != 0 && (uVar1 & 0x1f000000) != 0x4000000) {
    iVar2 = recff_metacall(J,rd,MM_tostring);
    if (iVar2 == 0) {
      uVar3 = uVar1 >> 0x18 & 0x1f;
      if (uVar3 - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar1;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar1 & 0x1f000000) == 0xe000000);
        TVar4 = lj_opt_fold(J);
      }
      else {
        if (2 < uVar3) {
          recff_nyi(J,rd);
          return;
        }
        o = (GCobj *)lj_strfmt_obj(J->L,rd->argv);
        TVar4 = lj_ir_kgc(J,o,IRT_STR);
      }
      *J->base = TVar4;
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_tostring(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_isstr(tr)) {
    /* Ignore __tostring in the string base metatable. */
    /* Pass on result in J->base[0]. */
  } else if (tr && !recff_metacall(J, rd, MM_tostring)) {
    if (tref_isnumber(tr)) {
      J->base[0] = emitir(IRT(IR_TOSTR, IRT_STR), tr,
			  tref_isnum(tr) ? IRTOSTR_NUM : IRTOSTR_INT);
    } else if (tref_ispri(tr)) {
      J->base[0] = lj_ir_kstr(J, lj_strfmt_obj(J->L, &rd->argv[0]));
    } else {
      recff_nyiu(J, rd);
      return;
    }
  }
}